

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O2

char * __thiscall dtc::dirname(dtc *this,char *__path)

{
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = ::dirname;
  local_10 = std::_Function_handler<char_*(char_*),_char_*(*)(char_*)_noexcept>::_M_invoke;
  local_18 = std::_Function_handler<char_*(char_*),_char_*(*)(char_*)_noexcept>::_M_manager;
  anon_unknown_3::dirbasename((string *)this,(function<char_*(char_*)> *)local_28,(string *)__path);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return (char *)this;
}

Assistant:

string dirname(const string &s)
{
	return dirbasename(::dirname, s);
}